

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O0

YSRESULT __thiscall YsSoundPlayer::SoundData::Resample(SoundData *this,int newRate)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int atTimeStep;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uchar *local_120;
  double newValue_1;
  double c;
  double a;
  double b;
  double d;
  double v [4];
  int newValue;
  double value_1 [2];
  ulong uStack_98;
  int value;
  size_t ch;
  uchar *newTimeStepPtr;
  double param;
  size_t oldTimeStep;
  double oldTimeStepD;
  size_t ts;
  uchar *newDat;
  size_t newSize;
  size_t newNTimeStep;
  size_t curNTimeStep;
  size_t bytePerTimeStep;
  size_t bytePerSample;
  size_t nChannel;
  int newRate_local;
  SoundData *this_local;
  
  if (this->rate != newRate) {
    iVar1 = 1;
    if (this->stereo == YSTRUE) {
      iVar1 = 2;
    }
    uVar5 = (ulong)(this->bit >> 3);
    uVar6 = (long)iVar1 * uVar5;
    uVar7 = this->sizeInBytes / uVar6;
    dVar8 = (double)((uVar7 * (long)newRate) / (ulong)this->rate);
    uVar9 = (long)dVar8 * uVar6;
    if (uVar9 == 0) {
      local_120 = (uchar *)0x0;
    }
    else {
      local_120 = (uchar *)operator_new__(uVar9);
    }
    if (local_120 != (uchar *)0x0) {
      for (oldTimeStepD = 0.0; (ulong)oldTimeStepD < (ulong)dVar8;
          oldTimeStepD = (double)((long)oldTimeStepD + 1)) {
        auVar17._8_4_ = 0;
        auVar17._0_8_ = uVar7;
        auVar17._12_4_ = 0x45300000;
        auVar18._8_4_ = (int)((ulong)oldTimeStepD >> 0x20);
        auVar18._0_8_ = oldTimeStepD;
        auVar18._12_4_ = 0x45300000;
        auVar19._8_4_ = (int)((ulong)dVar8 >> 0x20);
        auVar19._0_8_ = dVar8;
        auVar19._12_4_ = 0x45300000;
        dVar12 = (((auVar17._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) *
                 ((auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,SUB84(oldTimeStepD,0)) - 4503599627370496.0))) /
                 ((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,SUB84(dVar8,0)) - 4503599627370496.0));
        uVar10 = (long)dVar12 | (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f;
        dVar12 = fmod(dVar12,1.0);
        lVar11 = (long)oldTimeStepD * uVar6;
        for (uStack_98 = 0; uStack_98 < (ulong)(long)iVar1; uStack_98 = uStack_98 + 1) {
          iVar2 = (int)uStack_98;
          if (uVar10 < uVar7 - 1) {
            atTimeStep = (int)uVar10;
            if ((uVar10 == 0) || (uVar7 - 2 <= uVar10)) {
              iVar3 = GetSignedValueRaw(this,iVar2,atTimeStep);
              iVar2 = GetSignedValueRaw(this,iVar2,atTimeStep + 1);
              SetSignedValueRaw(this,local_120 + uVar5 * uStack_98 + lVar11,
                                (int)((double)iVar3 * (1.0 - dVar12) + (double)iVar2 * dVar12));
            }
            else {
              iVar3 = GetSignedValueRaw(this,iVar2,atTimeStep + -1);
              iVar4 = GetSignedValueRaw(this,iVar2,atTimeStep);
              dVar13 = (double)iVar4;
              iVar4 = GetSignedValueRaw(this,iVar2,atTimeStep + 1);
              dVar14 = (double)iVar4;
              iVar2 = GetSignedValueRaw(this,iVar2,atTimeStep + 2);
              dVar15 = (((double)iVar3 + dVar14) - (dVar13 + dVar13)) / 2.0;
              dVar16 = ((((double)iVar2 - (dVar14 + dVar14)) - (dVar15 + dVar15)) + dVar13) / 6.0;
              SetSignedValueRaw(this,local_120 + uVar5 * uStack_98 + lVar11,
                                (int)((((dVar14 - dVar16) - dVar15) - dVar13) * dVar12 +
                                      dVar16 * dVar12 * dVar12 * dVar12 + dVar15 * dVar12 * dVar12 +
                                     dVar13));
            }
          }
          else {
            iVar2 = GetSignedValueRaw(this,iVar2,(int)uVar7 + -1);
            SetSignedValueRaw(this,local_120 + uVar5 * uStack_98 + lVar11,iVar2);
          }
        }
      }
    }
    this->rate = newRate;
    if (this->dat != (uchar *)0x0) {
      operator_delete__(this->dat);
    }
    this->dat = local_120;
    this->sizeInBytes = (uint)uVar9;
  }
  return YSOK;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::Resample(int newRate)
{
	if(rate!=newRate)
	{
		const size_t nChannel=(YSTRUE==stereo ? 2 : 1);
		const size_t bytePerSample=bit/8;
		const size_t bytePerTimeStep=nChannel*bytePerSample;
		const size_t curNTimeStep=sizeInBytes/bytePerTimeStep;

		const size_t newNTimeStep=curNTimeStep*newRate/rate;
		const size_t newSize=newNTimeStep*bytePerTimeStep;

		unsigned char *newDat=(0<newSize ? new unsigned char [newSize] : NULL);
		if(NULL!=newDat)
		{
			for(size_t ts=0; ts<newNTimeStep; ts++)
			{
				double oldTimeStepD=(double)curNTimeStep*(double)ts/(double)newNTimeStep;
				size_t oldTimeStep=(size_t)oldTimeStepD;
				double param=fmod(oldTimeStepD,1.0);
				unsigned char *newTimeStepPtr=newDat+ts*bytePerTimeStep;

				for(size_t ch=0; ch<nChannel; ++ch)
				{
					if(curNTimeStep-1<=oldTimeStep)
					{
						const int value=GetSignedValueRaw(ch,curNTimeStep-1);
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,value);
					}
					else if(0==oldTimeStep || curNTimeStep-2<=oldTimeStep)
					{
						const double value[2]=
							{
								(double)GetSignedValueRaw(ch,oldTimeStep),
								(double)GetSignedValueRaw(ch,oldTimeStep+1)
							};
						const int newValue=(int)(value[0]*(1.0-param)+value[1]*param);
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,newValue);
					}
					else
					{
						const double v[4]=
							{
								(double)GetSignedValueRaw(ch,oldTimeStep-1),  // At x=-1.0
								(double)GetSignedValueRaw(ch,oldTimeStep),    // At x= 0.0
								(double)GetSignedValueRaw(ch,oldTimeStep+1),  // At x= 1.0
								(double)GetSignedValueRaw(ch,oldTimeStep+2)   // At x= 2.0
							};

						// Cubic interpolation.  Linear didn't work well.
						// axxx+bxx+cx+d=e
						// x=-1  -> -a+b-c+d=v0   (A)
						// x= 0  ->        d=v1   (B)
						// x= 1  ->  a+b+c+d=v2   (C)
						// x= 2  -> 8a+4b+2c+d=v3 (D)
						//
						// (B) =>  d=v1;
						// (A)+(C) => 2b+2d=v0+v2  => b=(v0+v2-2d)/2
						//
						// (D)-2*(B) =>  6a+2b-d=v3-2*v2
						//           =>  a=(v3-2*v2-2b+d)/6

						const double d=v[1];
						const double b=(v[0]+v[2]-2.0*d)/2.0;
						const double a=(v[3]-2.0*v[2]-2.0*b+d)/6.0;
						const double c=v[2]-a-b-d;

						double newValue=a*param*param*param
							+b*param*param
							+c*param
							+d;
						SetSignedValueRaw(newTimeStepPtr+bytePerSample*ch,(int)newValue);
					}
				}
			}
		}

		rate=newRate;
		delete [] dat;
		dat=newDat;
		sizeInBytes=newSize;
	}
	return YSOK;
}